

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,double kappa,double delta,double theta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  undefined8 uVar4;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  _Var5;
  bool bVar6;
  undefined8 extraout_RAX;
  long lVar7;
  long lVar8;
  _Head_base<0UL,_int_*,_false> _Var9;
  uint uVar10;
  type it;
  rc_data *ret;
  rc_data *__first;
  long lVar11;
  int iVar12;
  tuple<int_*,_std::default_delete<int[]>_> tVar13;
  ulong uVar14;
  ulong uVar15;
  rc_data *__last;
  long lVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 in_XMM4_Qb;
  undefined1 local_90 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_80;
  long local_78;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_70;
  unique_ptr<int[],_std::default_delete<int[]>_> local_68;
  _Head_base<0UL,_int_*,_false> local_60;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_58;
  pair<int,_int> *local_50;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_48;
  pair<int,_int> *local_40;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_38;
  
  if (first._M_current != last._M_current) {
    local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl =
         (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 8);
    dVar18 = kappa / (1.0 - kappa);
    local_50 = last._M_current;
    local_48._M_head_impl = (row_value *)theta;
    do {
      if (*(int *)(this + 0x80) <= (first._M_current)->first) {
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ();
LAB_00194542:
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      iVar12 = (int)local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl;
      local_70._M_t.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
           (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
            )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
              )(long)(first._M_current)->first;
      local_40 = first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_90,iVar12);
      if (local_90._8_8_ != local_90._0_8_) {
        lVar16 = *(long *)(this + 0x68);
        _Var9._M_head_impl = (int *)local_90._8_8_;
        do {
          *(double *)(lVar16 + (long)*_Var9._M_head_impl * 8) =
               (double)local_48._M_head_impl * *(double *)(lVar16 + (long)*_Var9._M_head_impl * 8);
          _Var9._M_head_impl = _Var9._M_head_impl + 8;
        } while (_Var9._M_head_impl != (int *)local_90._0_8_);
      }
      if (local_90._8_8_ == local_90._0_8_) {
        uVar15 = 0;
      }
      else {
        uVar15 = 0;
        _Var9._M_head_impl = (int *)local_90._8_8_;
        do {
          sparse_matrix<int>::column((sparse_matrix<int> *)&local_68,iVar12);
          if ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_60._M_head_impl ==
              (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
              local_68._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl) {
            dVar19 = 0.0;
          }
          else {
            auVar20 = ZEXT816(0);
            do {
              auVar25._0_8_ =
                   (double)*(int *)(*(long *)(this + 0x48) + (long)*local_60._M_head_impl * 4);
              auVar25._8_8_ = in_XMM4_Qb;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *(ulong *)(*(long *)(this + 0x68) + (long)*local_60._M_head_impl * 8);
              auVar20 = vfmadd231sd_fma(auVar20,auVar25,auVar1);
              dVar19 = auVar20._0_8_;
              local_60._M_head_impl = local_60._M_head_impl + 2;
            } while ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                     local_60._M_head_impl !=
                     (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                     local_68._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                     super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl);
          }
          lVar16 = *(long *)(this + 0x50);
          lVar7 = uVar15 * 0x10;
          *(int *)(lVar16 + 8 + lVar7) = (int)uVar15;
          *(undefined4 *)(lVar16 + 0xc + lVar7) =
               *(undefined4 *)(*(long *)(this + 0x48) + (long)*_Var9._M_head_impl * 4);
          *(double *)(lVar16 + lVar7) =
               *(double *)
                (*(long *)(*(long *)(this + 0x70) + 8) + (long)*(int *)(local_90._8_8_ + 4) * 8) -
               dVar19;
          _Var9._M_head_impl = _Var9._M_head_impl + 2;
          uVar15 = uVar15 + 1;
        } while (_Var9._M_head_impl != (int *)local_90._0_8_);
      }
      tVar13.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)(uVar15 & 0xffffffff);
      if (1 < (uint)uVar15) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)this;
        __first = *(rc_data **)(this + 0x50);
        std::
        __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + (long)tVar13.
                                           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>
                                           .super__Head_base<0UL,_int_*,_false>._M_head_impl,
                   (int)LZCOUNT(tVar13.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                super__Head_base<0UL,_int_*,_false>._M_head_impl) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + (long)tVar13.
                                           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>
                                           .super__Head_base<0UL,_int_*,_false>._M_head_impl);
        __last = __first + 1;
        lVar16 = (long)tVar13.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl * 0x10 + -0x10;
        do {
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar16 = lVar16 + -0x10;
        } while (lVar16 != 0);
        std::
        shuffle<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
      }
      _Var5._M_t.
      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
           local_70._M_t.
           super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
           .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl;
      local_80._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (tuple<int_*,_std::default_delete<int[]>_>)
           (tuple<int_*,_std::default_delete<int[]>_>)
           tVar13.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
      if (*(int *)(*(long *)(this + 0x58) +
                  (long)local_70._M_t.
                        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                        .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                        _M_head_impl * 0xc) < 1) {
        iVar12 = 0;
        uVar15 = 0xffffffff;
      }
      else {
        local_38._M_t.
        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
        .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
             (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
              )((long)(int)(uint)uVar15 + -2);
        lVar16 = 0;
        iVar12 = 0;
        uVar14 = 0xffffffffffffffff;
        do {
          uVar4 = local_90._8_8_;
          uVar15 = uVar14 + 1;
          iVar12 = iVar12 + *(int *)(*(long *)(this + 0x50) + 0xc + lVar16);
          local_78 = CONCAT44(local_78._4_4_,
                              *(undefined4 *)
                               (*(long *)(this + 0x58) +
                               (long)_Var5._M_t.
                                     super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                     .
                                     super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                     ._M_head_impl * 0xc));
          lVar7 = (long)*(int *)(*(long *)(this + 0x50) + 8 + lVar16);
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_90._8_8_ + (lVar7 * 2 + 1) * 4));
          auVar26._8_8_ = 0;
          auVar26._0_8_ = dVar18;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = delta;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = *(double *)(*(long *)(this + 0x50) + lVar16) * 0.5;
          auVar20 = vfmadd213sd_fma(auVar21,auVar26,auVar20);
          *(double *)(*(long *)(this + 0x68) + (long)*(int *)(uVar4 + lVar7 * 2 * 4) * 8) =
               auVar20._0_8_ +
               *(double *)(*(long *)(this + 0x68) + (long)*(int *)(uVar4 + lVar7 * 2 * 4) * 8);
          if ((int)(size_type)local_78 <= iVar12) break;
          lVar16 = lVar16 + 0x10;
          bVar6 = (long)uVar14 <
                  (long)local_38._M_t.
                        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                        .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                        _M_head_impl;
          uVar14 = uVar15;
        } while (bVar6);
      }
      uVar10 = (uint)uVar15;
      if (iVar12 < *(int *)(*(long *)(this + 0x58) +
                           (long)_Var5._M_t.
                                 super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                 .
                                 super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                 ._M_head_impl * 0xc)) {
        bVar6 = false;
      }
      else {
        bVar6 = iVar12 <= *(int *)(*(long *)(this + 0x58) +
                                   (long)_Var5._M_t.
                                         super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                         .
                                         super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                         ._M_head_impl * 0xc + 4);
      }
      if (((int)(uVar10 + 1) <
           (int)local_80._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                super__Head_base<0UL,_int_*,_false>._M_head_impl) && (bVar6)) {
        local_78 = (long)(int)local_80._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl;
        lVar16 = (long)(int)uVar10 << 4;
        lVar7 = (long)(int)uVar10 + 2;
        do {
          uVar4 = local_90._8_8_;
          lVar8 = *(long *)(this + 0x50);
          iVar12 = iVar12 + *(int *)(lVar8 + 0x1c + lVar16);
          if (iVar12 < *(int *)(*(long *)(this + 0x58) +
                               (long)_Var5._M_t.
                                     super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                     .
                                     super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                     ._M_head_impl * 0xc)) {
            bVar6 = false;
          }
          else {
            bVar6 = iVar12 <= *(int *)(*(long *)(this + 0x58) +
                                       (long)_Var5._M_t.
                                             super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                             .
                                             super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                             ._M_head_impl * 0xc + 4);
          }
          lVar11 = (long)*(int *)(lVar8 + 0x18 + lVar16);
          if (bVar6) {
            dVar19 = *(double *)(lVar8 + 0x10 + lVar16);
            bVar6 = dVar19 == 0.0;
            bVar17 = dVar19 < 0.0;
            if ((bVar6) && (!NAN(dVar19))) {
              dVar19 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 (*(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                    **)this);
              bVar6 = dVar19 == 0.5;
              bVar17 = 0.5 < dVar19;
            }
            bVar6 = !bVar17 && !bVar6;
          }
          if (bVar6) {
            bit_array_impl::set(&x->super_bit_array_impl,*(int *)(uVar4 + (lVar11 * 2 + 1) * 4));
            lVar8 = *(long *)(this + 0x68);
            auVar27._8_8_ = 0;
            auVar27._0_8_ = dVar18;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = delta;
            auVar22._8_8_ = 0;
            auVar22._0_8_ = *(double *)(*(long *)(this + 0x50) + 0x10 + lVar16) * 0.5;
            auVar20 = vfmadd213sd_fma(auVar22,auVar27,auVar2);
            lVar11 = (long)*(int *)(uVar4 + lVar11 * 2 * 4);
            dVar19 = auVar20._0_8_ + *(double *)(lVar8 + lVar11 * 8);
          }
          else {
            bit_array_impl::unset(&x->super_bit_array_impl,*(int *)(uVar4 + (lVar11 * 2 + 1) * 4));
            lVar8 = *(long *)(this + 0x68);
            auVar28._8_8_ = 0;
            auVar28._0_8_ = dVar18;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = delta;
            auVar23._8_8_ = 0;
            auVar23._0_8_ = *(double *)(*(long *)(this + 0x50) + 0x10 + lVar16) * 0.5;
            auVar20 = vfmadd213sd_fma(auVar23,auVar28,auVar3);
            lVar11 = (long)*(int *)(uVar4 + lVar11 * 2 * 4);
            dVar19 = *(double *)(lVar8 + lVar11 * 8) - auVar20._0_8_;
          }
          *(double *)(lVar8 + lVar11 * 8) = dVar19;
          bVar17 = lVar7 < local_78;
          uVar10 = (int)uVar15 + 1;
          uVar15 = (ulong)uVar10;
          lVar16 = lVar16 + 0x10;
          lVar7 = lVar7 + 1;
        } while ((bool)(bVar17 & bVar6));
      }
      if ((int)(uVar10 + 1) <
          (int)local_80._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        lVar16 = (long)(int)uVar10 << 4;
        iVar12 = ~uVar10 + (int)local_80._M_t.
                                super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                super__Head_base<0UL,_int_*,_false>._M_head_impl;
        do {
          uVar4 = local_90._8_8_;
          lVar7 = (long)*(int *)(*(long *)(this + 0x50) + 0x18 + lVar16);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_90._8_8_ + (lVar7 * 2 + 1) * 4));
          auVar30._8_8_ = 0;
          auVar30._0_8_ = dVar18;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = delta;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = *(double *)(*(long *)(this + 0x50) + 0x10 + lVar16) * 0.5;
          auVar20 = vfmadd213sd_fma(auVar24,auVar30,auVar29);
          *(double *)(*(long *)(this + 0x68) + (long)*(int *)(uVar4 + lVar7 * 2 * 4) * 8) =
               *(double *)(*(long *)(this + 0x68) + (long)*(int *)(uVar4 + lVar7 * 2 * 4) * 8) -
               auVar20._0_8_;
          lVar16 = lVar16 + 0x10;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      bVar6 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>,baryonyx::bit_array>
                        ((solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
                          *)this,(int)local_70._M_t.
                                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                      .
                                      super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                      ._M_head_impl,x);
      if (!bVar6) goto LAB_00194542;
      first._M_current = local_40 + 1;
    } while (first._M_current != local_50);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }